

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobalRefining.cpp
# Opt level: O0

Pass * wasm::createGlobalRefiningPass(void)

{
  Pass *this;
  
  this = (Pass *)operator_new(0x58);
  memset(this,0,0x58);
  anon_unknown_138::GlobalRefining::GlobalRefining((GlobalRefining *)this);
  return this;
}

Assistant:

Pass* createGlobalRefiningPass() { return new GlobalRefining(); }